

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_while::run_impl(statement_while *this)

{
  context_t *pcVar1;
  bool bVar2;
  element_type *peVar3;
  _Elt_pointer ppsVar4;
  statement_base *psVar5;
  undefined *puVar6;
  int iVar7;
  bool *pbVar8;
  _Map_pointer pppsVar9;
  _Elt_pointer ppsVar10;
  _Elt_pointer ppsVar11;
  scope_guard scope;
  scope_guard local_a8;
  statement_while *local_a0;
  tree_node *local_98;
  
  peVar3 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->break_block == true) {
    peVar3->break_block = false;
  }
  pcVar1 = &(this->super_statement_base).context;
  if (peVar3->continue_block == true) {
    peVar3->continue_block = false;
  }
  local_a8.context = pcVar1;
  domain_manager::add_domain(&(peVar3->super_runtime_type).storage);
  local_a0 = this;
  while( true ) {
    local_98 = (this->mTree).mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&stack0xffffffffffffff50,
               (iterator *)
               (((this->super_statement_base).context.
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance)
               .super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(&stack0xffffffffffffff68,0));
    pbVar8 = cs_impl::any::const_val<bool>((any *)&stack0xffffffffffffff50);
    bVar2 = *pbVar8;
    cs_impl::any::recycle((any *)&stack0xffffffffffffff50);
    puVar6 = current_process;
    if (bVar2 != true) break;
    if ((*current_process & 1) != 0) {
      LOCK();
      *current_process = 0;
      UNLOCK();
      event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
    }
    ppsVar11 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar4 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar11 != ppsVar4) {
      ppsVar10 = (this->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar9 = (this->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar6 = current_process;
        psVar5 = *ppsVar11;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
        }
        (*psVar5->_vptr_statement_base[3])(psVar5);
        peVar3 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar7 = 1;
        if (peVar3->return_fcall == false) {
          if (peVar3->break_block == true) {
            peVar3->break_block = false;
            goto LAB_0016a5e9;
          }
          if (peVar3->continue_block == true) {
            peVar3->continue_block = false;
            iVar7 = 4;
            goto LAB_0016a5e9;
          }
          iVar7 = 0;
          bVar2 = true;
        }
        else {
LAB_0016a5e9:
          bVar2 = false;
        }
        if (!bVar2) goto LAB_0016a61d;
        ppsVar11 = ppsVar11 + 1;
        if (ppsVar11 == ppsVar10) {
          ppsVar11 = pppsVar9[1];
          pppsVar9 = pppsVar9 + 1;
          ppsVar10 = ppsVar11 + 0x40;
        }
      } while (ppsVar11 != ppsVar4);
      iVar7 = 4;
LAB_0016a61d:
      this = local_a0;
      if (iVar7 != 4) break;
    }
    domain_manager::next_domain
              (&(((((element_type *)
                   (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(local_a8.context)->
                     super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->_M_dataplus)
                   ._M_p)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
  }
  scope_guard::~scope_guard(&stack0xffffffffffffff58);
  return;
}

Assistant:

void statement_while::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		while (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			current_process->poll_event();
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}